

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O2

void __thiscall CTB<UF>::PerformLabeling(CTB<UF> *this)

{
  undefined8 uVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  long lVar4;
  undefined4 uVar5;
  uint uVar6;
  uint *puVar7;
  int r_i;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar1;
  local_98.width = (int)((ulong)uVar1 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UF::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *UF::P_ = 0;
  UF::length_ = 1;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar6 = *(uint *)&pMVar2->field_0xc;
  lVar8 = (long)(int)uVar6;
  lVar13 = (long)*(int *)&pMVar2->field_0x8;
  uVar15 = 0;
  uVar16 = 0;
  if (0 < (int)uVar6) {
    uVar16 = (ulong)uVar6;
  }
  lVar14 = -1;
  lVar22 = 1;
  do {
    if (lVar13 <= (long)uVar15) {
      uVar6 = UF::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      for (lVar8 = 0; puVar7 = UF::P_, lVar8 < *(int *)&pMVar3->field_0x8; lVar8 = lVar8 + 1) {
        lVar13 = **(long **)&pMVar3->field_0x48 * lVar8 + *(long *)&pMVar3->field_0x10;
        iVar12 = *(int *)&pMVar3->field_0xc;
        for (lVar14 = 0; (long)iVar12 * 4 != lVar14; lVar14 = lVar14 + 4) {
          *(uint *)(lVar13 + lVar14) = puVar7[*(uint *)(lVar13 + lVar14)];
        }
      }
      UF::Dealloc();
      return;
    }
    pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar17 = *(long *)&pMVar2->field_0x10;
    lVar20 = **(long **)&pMVar2->field_0x48;
    lVar10 = *(long *)&pMVar3->field_0x10;
    lVar4 = **(long **)&pMVar3->field_0x48;
    lVar11 = lVar4 * uVar15 + lVar10;
    uVar23 = uVar15 | 1;
    lVar18 = lVar4 * lVar14 + lVar10;
    lVar19 = lVar20 * lVar14 + lVar17;
    lVar10 = lVar4 * lVar22 + lVar10;
    lVar9 = lVar20 * lVar22 + lVar17;
    lVar17 = lVar20 * uVar15 + lVar17;
    lVar20 = -4;
    lVar21 = 0;
    uVar5 = 0xffffffff;
    iVar12 = -1;
    for (lVar24 = 1; lVar24 - uVar16 != 1; lVar24 = lVar24 + 1) {
      switch(uVar5) {
      case 1:
        if (*(char *)(lVar17 + -1 + lVar24) != '\0') {
          if (uVar15 == 0) {
LAB_00197ee4:
            UF::P_[UF::length_] = UF::length_;
            uVar6 = UF::length_ + 1;
            *(uint *)(lVar11 + -4 + lVar24 * 4) = UF::length_;
            UF::length_ = uVar6;
LAB_00197f09:
            iVar12 = 6;
          }
          else if (*(char *)(lVar19 + -1 + lVar24) == '\0') {
            if ((lVar8 <= lVar24) || (*(char *)(lVar19 + lVar24) == '\0')) {
              if ((lVar24 == 1) || (*(char *)(lVar19 + -2 + lVar24) == '\0')) goto LAB_00197ee4;
              *(undefined4 *)(lVar11 + -4 + lVar24 * 4) = *(undefined4 *)(lVar18 + -8 + lVar24 * 4);
              goto LAB_00197f09;
            }
            uVar6 = *(uint *)(lVar18 + lVar24 * 4);
            *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
            iVar12 = 5;
            if ((lVar24 != 1) && (*(char *)(lVar19 + -2 + lVar24) != '\0')) {
              UF::Merge(uVar6,*(uint *)(lVar18 + -8 + lVar24 * 4));
              iVar12 = 5;
            }
          }
          else {
            *(undefined4 *)(lVar11 + -4 + lVar24 * 4) = *(undefined4 *)(lVar18 + -4 + lVar24 * 4);
            iVar12 = 4;
          }
          if (((long)uVar23 < lVar13) && (*(char *)(lVar9 + -1 + lVar24) != '\0')) {
            *(undefined4 *)(lVar10 + -4 + lVar24 * 4) = *(undefined4 *)(lVar11 + -4 + lVar24 * 4);
          }
          goto LAB_00197f2d;
        }
        if ((lVar13 <= (long)uVar23) || (*(char *)(lVar9 + -1 + lVar24) == '\0')) goto LAB_00197bf6;
        UF::P_[UF::length_] = UF::length_;
        uVar6 = UF::length_ + 1;
        *(uint *)(lVar10 + -4 + lVar24 * 4) = UF::length_;
        UF::length_ = uVar6;
        uVar5 = 3;
        break;
      case 2:
        if (*(char *)(lVar17 + -1 + lVar24) != '\0') {
          if (iVar12 == 6) {
            uVar6 = *(uint *)(lVar11 + -8 + lVar24 * 4);
            *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
            iVar12 = 6;
            uVar5 = 2;
            if (uVar15 != 0) {
              iVar12 = 6;
              uVar5 = 2;
              if (lVar24 < lVar8) {
                iVar12 = 6;
                uVar5 = 2;
                if (*(char *)(lVar19 + lVar24) != '\0') {
                  UF::Merge(uVar6,*(uint *)(lVar18 + lVar24 * 4));
                  uVar5 = 2;
                  goto LAB_00197dd2;
                }
              }
            }
          }
          else {
            if (iVar12 != 5) {
              uVar5 = 2;
              goto LAB_001979ac;
            }
LAB_001979f7:
            *(undefined4 *)(lVar11 + -4 + lVar24 * 4) = *(undefined4 *)(lVar11 + -8 + lVar24 * 4);
            uVar5 = 5;
            iVar12 = 5;
          }
          goto LAB_00197a06;
        }
LAB_00197a39:
        if (((long)uVar23 < lVar13) && (*(char *)(lVar9 + -1 + lVar24) != '\0')) {
          *(undefined4 *)(lVar10 + -4 + lVar24 * 4) = *(undefined4 *)(lVar11 + -8 + lVar24 * 4);
          goto LAB_00197a62;
        }
LAB_00197bf6:
        uVar5 = 1;
        break;
      case 3:
      case 7:
      case 9:
        if (*(char *)(lVar17 + -1 + lVar24) == '\0') {
          if ((lVar13 <= (long)uVar23) || (*(char *)(lVar9 + -1 + lVar24) == '\0'))
          goto LAB_00197bf6;
          *(undefined4 *)(lVar10 + -4 + lVar24 * 4) = *(undefined4 *)(lVar10 + -8 + lVar24 * 4);
          uVar5 = 9;
        }
        else {
          if (uVar15 == 0) {
LAB_00197ae1:
            uVar6 = *(uint *)(lVar10 + -8 + lVar24 * 4);
            *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
            iVar12 = 6;
            if ((lVar24 != 1 && uVar15 != 0) &&
               (iVar12 = 6, *(char *)(lVar19 + -2 + lVar24) != '\0')) {
              puVar7 = (uint *)((lVar11 - lVar4) + (lVar21 + -1) * 4);
              iVar12 = 6;
LAB_00197b24:
              UF::Merge(uVar6,*puVar7);
            }
          }
          else {
            if (*(char *)(lVar19 + -1 + lVar24) != '\0') {
              uVar6 = *(uint *)(lVar18 + -4 + lVar24 * 4);
              *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
              puVar7 = (uint *)(lVar4 + lVar11 + -4 + lVar21 * 4);
              iVar12 = 4;
              goto LAB_00197b24;
            }
            if ((lVar8 <= lVar24) || (*(char *)(lVar19 + lVar24) == '\0')) goto LAB_00197ae1;
            uVar6 = *(uint *)(lVar18 + lVar24 * 4);
            *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
            UF::Merge(uVar6,*(uint *)(lVar10 + -8 + lVar24 * 4));
            iVar12 = 5;
            if ((lVar24 != 1) && (*(char *)(lVar19 + -2 + lVar24) != '\0')) {
              uVar6 = *(uint *)(lVar11 + -4 + lVar24 * 4);
              puVar7 = (uint *)(lVar18 + lVar20);
              goto LAB_00197b24;
            }
          }
          if (((long)uVar23 < lVar13) && (*(char *)(lVar9 + -1 + lVar24) != '\0')) {
            *(undefined4 *)(lVar10 + -4 + lVar24 * 4) = *(undefined4 *)(lVar11 + -4 + lVar24 * 4);
          }
          uVar5 = 8;
        }
        break;
      case 4:
        if (*(char *)(lVar17 + -1 + lVar24) == '\0') goto LAB_00197a39;
        if (iVar12 == 6) {
          uVar6 = *(uint *)(lVar11 + -8 + lVar24 * 4);
          *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
          iVar12 = 6;
          uVar5 = 4;
          if (uVar15 == 0) goto LAB_00197a06;
LAB_00197d05:
          iVar12 = 6;
          uVar5 = 4;
          if (lVar24 < lVar8) {
            iVar12 = 6;
            uVar5 = 4;
            if (*(char *)(lVar19 + lVar24) != '\0') {
              UF::Merge(uVar6,*(uint *)(lVar18 + lVar24 * 4));
              uVar5 = 4;
LAB_00197dd2:
              iVar12 = 5;
            }
          }
        }
        else {
          if (iVar12 == 5) goto LAB_001979f7;
          uVar5 = 4;
LAB_001979ac:
          if (iVar12 == 4) {
            uVar6 = *(uint *)(lVar11 + -8 + lVar24 * 4);
            *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
            iVar12 = 6;
            uVar5 = 4;
            if (uVar15 != 0) {
              uVar5 = 4;
              iVar12 = 4;
              if (*(char *)(lVar19 + -1 + lVar24) == '\0') goto LAB_00197d05;
            }
          }
        }
        goto LAB_00197a06;
      case 5:
        if (*(char *)(lVar17 + -1 + lVar24) == '\0') goto LAB_00197a39;
        uVar6 = *(uint *)(lVar11 + -8 + lVar24 * 4);
        *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
        iVar12 = 6;
        if ((((uVar15 != 0) && (iVar12 = 4, *(char *)(lVar19 + -1 + lVar24) == '\0')) &&
            (iVar12 = 6, lVar24 < lVar8)) && (iVar12 = 6, *(char *)(lVar19 + lVar24) != '\0')) {
          UF::Merge(uVar6,*(uint *)(lVar18 + lVar24 * 4));
          iVar12 = 5;
        }
        if (((long)uVar23 < lVar13) && (*(char *)(lVar9 + -1 + lVar24) != '\0')) {
          *(undefined4 *)(lVar10 + -4 + lVar24 * 4) = *(undefined4 *)(lVar11 + -4 + lVar24 * 4);
        }
        uVar5 = 4;
        break;
      case 6:
        if (*(char *)(lVar17 + -1 + lVar24) == '\0') goto LAB_00197a39;
        if (iVar12 == 6) {
          uVar6 = *(uint *)(lVar11 + -8 + lVar24 * 4);
          *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
          iVar12 = 6;
          uVar5 = 6;
          if (uVar15 != 0) {
            iVar12 = 6;
            uVar5 = 6;
            if (lVar24 < lVar8) {
              iVar12 = 6;
              uVar5 = 6;
              if (*(char *)(lVar19 + lVar24) != '\0') {
                UF::Merge(uVar6,*(uint *)(lVar18 + lVar24 * 4));
                iVar12 = 5;
                uVar5 = 6;
              }
            }
          }
        }
        else {
          uVar5 = 6;
          if (iVar12 == 5) goto LAB_001979f7;
        }
        goto LAB_00197a06;
      case 8:
        if (*(char *)(lVar17 + -1 + lVar24) == '\0') goto LAB_00197a39;
        if (iVar12 != 6) {
          if (iVar12 == 5) goto LAB_001979f7;
          uVar5 = 8;
          goto LAB_001979ac;
        }
        uVar6 = *(uint *)(lVar11 + -8 + lVar24 * 4);
        *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
        iVar12 = 6;
        uVar5 = 8;
        if (uVar15 != 0) {
          iVar12 = 6;
          uVar5 = 8;
          if (lVar24 < lVar8) {
            iVar12 = 6;
            uVar5 = 8;
            if (*(char *)(lVar19 + lVar24) != '\0') {
              UF::Merge(uVar6,*(uint *)(lVar18 + lVar24 * 4));
              uVar5 = 8;
              goto LAB_00197dd2;
            }
          }
        }
LAB_00197a06:
        if (((long)uVar23 < lVar13) && (*(char *)(lVar9 + -1 + lVar24) != '\0')) {
          *(undefined4 *)(lVar10 + -4 + lVar24 * 4) = *(undefined4 *)(lVar11 + -4 + lVar24 * 4);
        }
        break;
      case 0xffffffff:
        if (*(char *)(lVar17 + -1 + lVar24) == '\0') {
          if ((lVar13 <= (long)uVar23) || (*(char *)(lVar9 + -1 + lVar24) == '\0'))
          goto LAB_00197bf6;
          UF::P_[UF::length_] = UF::length_;
          uVar6 = UF::length_ + 1;
          *(uint *)(lVar10 + -4 + lVar24 * 4) = UF::length_;
          UF::length_ = uVar6;
LAB_00197a62:
          uVar5 = 7;
        }
        else {
          if (uVar15 == 0) {
LAB_00197dfb:
            UF::P_[UF::length_] = UF::length_;
            iVar12 = 6;
            uVar6 = UF::length_;
            UF::length_ = UF::length_ + 1;
          }
          else if (*(char *)(lVar19 + -1 + lVar24) == '\0') {
            if ((lVar8 <= lVar24) || (*(char *)(lVar19 + lVar24) == '\0')) goto LAB_00197dfb;
            uVar6 = *(uint *)(lVar18 + lVar24 * 4);
            iVar12 = 5;
          }
          else {
            uVar6 = *(uint *)(lVar18 + -4 + lVar24 * 4);
            iVar12 = 4;
          }
          *(uint *)(lVar11 + -4 + lVar24 * 4) = uVar6;
          if (((long)uVar23 < lVar13) && (*(char *)(lVar9 + -1 + lVar24) != '\0')) {
            *(uint *)(lVar10 + -4 + lVar24 * 4) = uVar6;
          }
LAB_00197f2d:
          uVar5 = 2;
        }
      }
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 4;
    }
    uVar15 = uVar15 + 2;
    lVar14 = lVar14 + 2;
    lVar22 = lVar22 + 2;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }